

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.h
# Opt level: O3

int pstack::Procman::threadListCb<pstack::Procman::Process::getStacks[abi:cxx11]()::__1>
              (td_thrhandle_t *thr,void *v)

{
  long *plVar1;
  Process *p;
  long lVar2;
  int iVar3;
  _List_node_base *p_Var4;
  undefined1 local_108 [8];
  CoreRegisters regs;
  
  p = *v;
  iVar3 = td_thr_getgregs();
  if (iVar3 == 0) {
    lVar2 = *(long *)((long)v + 8);
    p_Var4 = (_List_node_base *)operator_new(0x1a8);
    memset(p_Var4 + 1,0,0x198);
    std::__detail::_List_node_base::_M_hook(p_Var4);
    plVar1 = (long *)(lVar2 + 0x10);
    *plVar1 = *plVar1 + 1;
    td_thr_get_info(thr,*(long *)(*(long *)((long)v + 8) + 8) + 0x10);
    ThreadStack::unwind((ThreadStack *)(*(long *)(*(long *)((long)v + 8) + 8) + 0x10),p,
                        (CoreRegisters *)local_108);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              (*(_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> **)
                ((long)v + 0x10),(int *)(*(long *)(*(long *)((long)v + 8) + 8) + 0x78));
  }
  return 0;
}

Assistant:

int
threadListCb(const td_thrhandle_t *thr, void *v)
{ T &callback = *(T *)v; callback(thr); return 0; }